

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalGenerator::GetDeviceLinkFlags
          (cmLocalGenerator *this,cmLinkLineDeviceComputer *linkLineComputer,string *config,
          string *linkLibs,string *linkFlags,string *frameworkPath,string *linkPath,
          cmGeneratorTarget *target)

{
  cmMakefile *this_00;
  bool bVar1;
  cmComputeLinkInformation *cli;
  string *psVar2;
  allocator<char> local_f1;
  string local_f0;
  undefined1 local_d0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  linkOpts;
  string local_b0;
  cmValue local_90;
  cmValue cudaIPOFlags;
  undefined1 local_80 [7];
  bool ipoEnabled;
  string linklang;
  cmComputeLinkInformation *pcli;
  DeviceLinkSetter setter;
  string *frameworkPath_local;
  string *linkFlags_local;
  string *linkLibs_local;
  string *config_local;
  cmLinkLineDeviceComputer *linkLineComputer_local;
  cmLocalGenerator *this_local;
  
  setter._8_8_ = frameworkPath;
  cmGeneratorTarget::DeviceLinkSetter::DeviceLinkSetter((DeviceLinkSetter *)&pcli,target);
  cli = cmGeneratorTarget::GetLinkInformation(target,config);
  (*(linkLineComputer->super_cmLinkLineComputer)._vptr_cmLinkLineComputer[4])
            (local_80,linkLineComputer,target,config);
  cudaIPOFlags.Value._7_1_ = cmGeneratorTarget::IsIPOEnabled(target,(string *)local_80,config);
  if (!(bool)cudaIPOFlags.Value._7_1_) {
    cudaIPOFlags.Value._7_1_ =
         cmLinkLineDeviceComputer::ComputeRequiresDeviceLinkingIPOFlag(linkLineComputer,cli);
  }
  if ((bool)cudaIPOFlags.Value._7_1_ != false) {
    this_00 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"CMAKE_CUDA_DEVICE_LINK_OPTIONS_IPO",
               (allocator<char> *)
               ((long)&linkOpts.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    local_90 = cmMakefile::GetDefinition(this_00,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&linkOpts.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    bVar1 = cmValue::operator_cast_to_bool(&local_90);
    if (bVar1) {
      psVar2 = cmValue::operator_cast_to_string_(&local_90);
      std::__cxx11::string::operator+=((string *)linkFlags,(string *)psVar2);
    }
  }
  if (cli != (cmComputeLinkInformation *)0x0) {
    OutputLinkLibraries(this,cli,&linkLineComputer->super_cmLinkLineComputer,linkLibs,
                        (string *)setter._8_8_,linkPath);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"CUDA",&local_f1);
  cmGeneratorTarget::GetLinkOptions
            (target,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_d0,config,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  AppendCompileOptions
            (this,linkFlags,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_d0,(char *)0x0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_d0);
  std::__cxx11::string::~string((string *)local_80);
  cmGeneratorTarget::DeviceLinkSetter::~DeviceLinkSetter((DeviceLinkSetter *)&pcli);
  return;
}

Assistant:

void cmLocalGenerator::GetDeviceLinkFlags(
  cmLinkLineDeviceComputer& linkLineComputer, const std::string& config,
  std::string& linkLibs, std::string& linkFlags, std::string& frameworkPath,
  std::string& linkPath, cmGeneratorTarget* target)
{
  cmGeneratorTarget::DeviceLinkSetter setter(*target);

  cmComputeLinkInformation* pcli = target->GetLinkInformation(config);

  auto linklang = linkLineComputer.GetLinkerLanguage(target, config);
  auto ipoEnabled = target->IsIPOEnabled(linklang, config);
  if (!ipoEnabled) {
    ipoEnabled = linkLineComputer.ComputeRequiresDeviceLinkingIPOFlag(*pcli);
  }
  if (ipoEnabled) {
    if (cmValue cudaIPOFlags = this->Makefile->GetDefinition(
          "CMAKE_CUDA_DEVICE_LINK_OPTIONS_IPO")) {
      linkFlags += cudaIPOFlags;
    }
  }

  if (pcli) {
    // Compute the required device link libraries when
    // resolving gpu lang device symbols
    this->OutputLinkLibraries(pcli, &linkLineComputer, linkLibs, frameworkPath,
                              linkPath);
  }

  // iterate link deps and see if any of them need IPO

  std::vector<std::string> linkOpts;
  target->GetLinkOptions(linkOpts, config, "CUDA");
  // LINK_OPTIONS are escaped.
  this->AppendCompileOptions(linkFlags, linkOpts);
}